

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session_base.cpp
# Opt level: O0

session_base_t *
zmq::session_base_t::create
          (io_thread_t *io_thread_,bool active_,socket_base_t *socket_,options_t *options_,
          address_t *addr_)

{
  size_type sVar1;
  dish_session_t *pdVar2;
  int *piVar3;
  long in_RCX;
  session_base_t *s;
  address_t *in_stack_ffffffffffffff08;
  options_t *in_stack_ffffffffffffff10;
  socket_base_t *in_stack_ffffffffffffff18;
  options_t *in_stack_ffffffffffffff20;
  socket_base_t *in_stack_ffffffffffffff28;
  radio_session_t *in_stack_ffffffffffffff30;
  undefined1 active__00;
  io_thread_t *in_stack_ffffffffffffff38;
  session_base_t *in_stack_ffffffffffffff40;
  dish_session_t *local_b8;
  dish_session_t *local_a8;
  dish_session_t *local_38;
  
  switch(*(undefined1 *)(in_RCX + 0x134)) {
  case 0:
  case 1:
  case 2:
  case 4:
  case 5:
  case 6:
  case 7:
  case 8:
  case 9:
  case 10:
  case 0xb:
  case 0xc:
  case 0xd:
  case 0x10:
  case 0x11:
  case 0x12:
  case 0x13:
  case 0x14:
    if (((*(byte *)(in_RCX + 0x4d0) & 1) == 0) ||
       (sVar1 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                          ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)(in_RCX + 0x4b8)
                          ), sVar1 == 0)) {
      active__00 = (undefined1)((ulong)in_stack_ffffffffffffff30 >> 0x38);
      pdVar2 = (dish_session_t *)operator_new(0x5f8,(nothrow_t *)&std::nothrow);
      local_38 = (dish_session_t *)0x0;
      if (pdVar2 != (dish_session_t *)0x0) {
        session_base_t(in_stack_ffffffffffffff40,in_stack_ffffffffffffff38,(bool)active__00,
                       in_stack_ffffffffffffff28,in_stack_ffffffffffffff20,(address_t *)0x0);
        local_38 = pdVar2;
      }
    }
    else {
      pdVar2 = (dish_session_t *)operator_new(0x600,(nothrow_t *)&std::nothrow);
      local_38 = (dish_session_t *)0x0;
      if (pdVar2 != (dish_session_t *)0x0) {
        hello_msg_session_t::hello_msg_session_t
                  ((hello_msg_session_t *)in_stack_ffffffffffffff30,(io_thread_t *)0x0,
                   SUB81((ulong)pdVar2 >> 0x38,0),in_stack_ffffffffffffff18,
                   in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
        local_38 = pdVar2;
      }
    }
    break;
  case 3:
    pdVar2 = (dish_session_t *)operator_new(0x600,(nothrow_t *)&std::nothrow);
    local_a8 = (dish_session_t *)0x0;
    if (pdVar2 != (dish_session_t *)0x0) {
      req_session_t::req_session_t
                ((req_session_t *)in_stack_ffffffffffffff30,(io_thread_t *)in_stack_ffffffffffffff28
                 ,SUB81((ulong)in_stack_ffffffffffffff20 >> 0x38,0),in_stack_ffffffffffffff18,
                 in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
      local_a8 = pdVar2;
    }
    local_38 = local_a8;
    break;
  case 0xe:
    pdVar2 = (dish_session_t *)operator_new(0x640,(nothrow_t *)&std::nothrow);
    local_b8 = (dish_session_t *)0x0;
    if (pdVar2 != (dish_session_t *)0x0) {
      radio_session_t::radio_session_t
                (in_stack_ffffffffffffff30,(io_thread_t *)in_stack_ffffffffffffff28,
                 SUB81((ulong)in_stack_ffffffffffffff20 >> 0x38,0),in_stack_ffffffffffffff18,
                 in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
      local_b8 = pdVar2;
    }
    local_38 = local_b8;
    break;
  case 0xf:
    pdVar2 = (dish_session_t *)operator_new(0x640,(nothrow_t *)&std::nothrow);
    local_38 = (dish_session_t *)0x0;
    if (pdVar2 != (dish_session_t *)0x0) {
      dish_session_t::dish_session_t
                (pdVar2,(io_thread_t *)in_stack_ffffffffffffff28,
                 SUB81((ulong)in_stack_ffffffffffffff20 >> 0x38,0),in_stack_ffffffffffffff18,
                 in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
      local_38 = pdVar2;
    }
    break;
  default:
    piVar3 = __errno_location();
    *piVar3 = 0x16;
    return (session_base_t *)0x0;
  }
  if (local_38 == (dish_session_t *)0x0) {
    fprintf(_stderr,"FATAL ERROR: OUT OF MEMORY (%s:%d)\n",
            "/workspace/llm4binary/github/license_c_cmakelists/CERT-Polska[P]ursadb/extern/libzmq/src/session_base.cpp"
            ,0x6f);
    fflush(_stderr);
    zmq_abort((char *)0x3023f1);
  }
  return &local_38->super_session_base_t;
}

Assistant:

zmq::session_base_t *zmq::session_base_t::create (class io_thread_t *io_thread_,
                                                  bool active_,
                                                  class socket_base_t *socket_,
                                                  const options_t &options_,
                                                  address_t *addr_)
{
    session_base_t *s = NULL;
    switch (options_.type) {
        case ZMQ_REQ:
            s = new (std::nothrow)
              req_session_t (io_thread_, active_, socket_, options_, addr_);
            break;
        case ZMQ_RADIO:
            s = new (std::nothrow)
              radio_session_t (io_thread_, active_, socket_, options_, addr_);
            break;
        case ZMQ_DISH:
            s = new (std::nothrow)
              dish_session_t (io_thread_, active_, socket_, options_, addr_);
            break;
        case ZMQ_DEALER:
        case ZMQ_REP:
        case ZMQ_ROUTER:
        case ZMQ_PUB:
        case ZMQ_XPUB:
        case ZMQ_SUB:
        case ZMQ_XSUB:
        case ZMQ_PUSH:
        case ZMQ_PULL:
        case ZMQ_PAIR:
        case ZMQ_STREAM:
        case ZMQ_SERVER:
        case ZMQ_CLIENT:
        case ZMQ_GATHER:
        case ZMQ_SCATTER:
        case ZMQ_DGRAM:
        case ZMQ_PEER:
        case ZMQ_CHANNEL:
#ifdef ZMQ_BUILD_DRAFT_API
            if (options_.can_send_hello_msg && options_.hello_msg.size () > 0)
                s = new (std::nothrow) hello_msg_session_t (
                  io_thread_, active_, socket_, options_, addr_);
            else
                s = new (std::nothrow) session_base_t (
                  io_thread_, active_, socket_, options_, addr_);

            break;
#else
            s = new (std::nothrow)
              session_base_t (io_thread_, active_, socket_, options_, addr_);
            break;
#endif

        default:
            errno = EINVAL;
            return NULL;
    }
    alloc_assert (s);
    return s;
}